

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluUtil.cpp
# Opt level: O2

EGLDisplay eglu::getAndInitDisplay(NativeDisplay *nativeDisplay,Version *version)

{
  int iVar1;
  deUint32 err;
  undefined4 extraout_var;
  EGLDisplay pvVar3;
  Version VVar4;
  int minor;
  int major;
  int local_20;
  int local_1c;
  long *plVar2;
  
  iVar1 = (*nativeDisplay->_vptr_NativeDisplay[2])();
  plVar2 = (long *)CONCAT44(extraout_var,iVar1);
  pvVar3 = getDisplay(nativeDisplay);
  (**(code **)(*plVar2 + 0x128))(plVar2,pvVar3,&local_1c,&local_20);
  err = (**(code **)(*plVar2 + 0xf8))(plVar2);
  checkError(err,"initialize(display, &major, &minor)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluUtil.cpp"
             ,0x10f);
  if (version != (Version *)0x0) {
    VVar4.m_minor = local_20;
    VVar4.m_major = local_1c;
    *version = VVar4;
  }
  return pvVar3;
}

Assistant:

EGLDisplay getAndInitDisplay (NativeDisplay& nativeDisplay, Version* version)
{
	const Library&	egl		= nativeDisplay.getLibrary();
	EGLDisplay		display	= getDisplay(nativeDisplay);
	int				major, minor;

	EGLU_CHECK_CALL(egl, initialize(display, &major, &minor));

	if (version)
		*version = Version(major, minor);

	return display;
}